

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O0

bool __thiscall
cmGhsMultiTargetGenerator::ComputeCustomCommandOrder
          (cmGhsMultiTargetGenerator *this,
          vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *order)

{
  bool bVar1;
  reference ppcVar2;
  bool r;
  cmSourceFile *si;
  iterator __end1;
  iterator __begin1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1;
  undefined1 local_98 [8];
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
  perm;
  set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
  temp;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *order_local;
  cmGhsMultiTargetGenerator *this_local;
  
  std::
  set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
  ::set((set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
         *)&perm._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
  ::set((set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
         *)&customCommands.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_98);
  cmGeneratorTarget::GetCustomCommands
            (this->GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_98,
             &this->ConfigName);
  __end1 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                     ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                      local_98);
  si = (cmSourceFile *)
       std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                 ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_98);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                     *)&si), bVar1) {
    ppcVar2 = __gnu_cxx::
              __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
              ::operator*(&__end1);
    this_local._7_1_ =
         VisitCustomCommand(this,(set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
                                  *)&perm._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
                             *)&customCommands.
                                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,order,*ppcVar2);
    if (this_local._7_1_) goto LAB_002b1471;
    __gnu_cxx::
    __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
    ::operator++(&__end1);
  }
  this_local._7_1_ = false;
LAB_002b1471:
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_98);
  std::
  set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
  ::~set((set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
          *)&customCommands.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage);
  std::
  set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
  ::~set((set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
          *)&perm._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return this_local._7_1_;
}

Assistant:

bool cmGhsMultiTargetGenerator::ComputeCustomCommandOrder(
  std::vector<cmSourceFile const*>& order)
{
  std::set<cmSourceFile const*> temp;
  std::set<cmSourceFile const*> perm;

  // Collect all custom commands for this target
  std::vector<cmSourceFile const*> customCommands;
  this->GeneratorTarget->GetCustomCommands(customCommands, this->ConfigName);

  for (cmSourceFile const* si : customCommands) {
    bool r = VisitCustomCommand(temp, perm, order, si);
    if (r) {
      return r;
    }
  }
  return false;
}